

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.cpp
# Opt level: O1

void __thiscall vera::Material::set(Material *this,string *_property,float *_array1D,int _n)

{
  mapped_type *pmVar1;
  mapped_type *pmVar2;
  int iVar3;
  ulong uVar4;
  float *pfVar5;
  float local_20 [4];
  
  local_20[3] = 0.0;
  local_20[2] = 0.0;
  local_20[1] = 0.0;
  local_20[0] = 1.0;
  if (0 < _n) {
    uVar4 = 0;
    do {
      if (uVar4 == 4) {
        __assert_fail("(i) >= 0 && (i) < (this->length())",
                      "/workspace/llm4binary/github/license_c_cmakelists/patriciogonzalezvivo[P]glslViewer/deps/vera/deps/glm/glm/./ext/../detail/type_vec4.inl"
                      ,0x1e1,
                      "T &glm::vec<4, float>::operator[](typename vec<4, T, Q>::length_type) [L = 4, T = float, Q = glm::packed_highp]"
                     );
      }
      iVar3 = (int)uVar4;
      pfVar5 = local_20;
      if (((iVar3 != 3) && (pfVar5 = local_20 + 1, iVar3 != 2)) &&
         (pfVar5 = local_20 + 3, iVar3 == 1)) {
        pfVar5 = local_20 + 2;
      }
      *pfVar5 = _array1D[uVar4];
      uVar4 = uVar4 + 1;
    } while ((uint)_n != uVar4);
  }
  pmVar1 = std::
           map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<4,_float,_(glm::qualifier)0>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<4,_float,_(glm::qualifier)0>_>_>_>
           ::operator[](&this->colors,_property);
  (pmVar1->field_0).x = local_20[3];
  (pmVar1->field_1).y = local_20[2];
  (pmVar1->field_2).z = local_20[1];
  (pmVar1->field_3).w = local_20[0];
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::MaterialPropertyType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::MaterialPropertyType>_>_>
           ::operator[](&this->properties,_property);
  *pmVar2 = COLOR;
  return;
}

Assistant:

void Material::set(const std::string& _property, const float* _array1D, int _n) {
    glm::vec4 color = glm::vec4(0.0f, 0.0f, 0.0f, 1.0f);
    for (int i = 0; i < _n; i++)
        color[i] = _array1D[i];
    
    colors[_property] = color;
    properties[_property] = COLOR;
}